

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Maybe<const_capnp::StructSchema::Field_&> __thiscall
kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::find<capnp::Text::Reader>
          (HashMap<kj::StringPtr,_capnp::StructSchema::Field> *this,Reader *key)

{
  Maybe<const_kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry_&> MVar1;
  
  MVar1 = Table<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>>
          ::find<0ul,capnp::Text::Reader&>
                    ((Table<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>>
                      *)this,key);
  if (MVar1.ptr != (Entry *)0x0) {
    MVar1.ptr = (Entry *)&(MVar1.ptr)->value;
  }
  return (Maybe<const_capnp::StructSchema::Field_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<const Value&> HashMap<Key, Value>::find(KeyLike&& key) const {
  return table.find(key).map([](const Entry& e) -> const Value& { return e.value; });
}